

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createN2S(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  ConstantString *pCVar2;
  string *this_00;
  allocator<char> local_91;
  Value *rhs_local;
  string local_88;
  char buf [64];
  
  rhs_local = rhs;
  if (rhs->type_ == Number) {
    lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                           0);
    if (lVar1 == 0) {
      local_88._M_dataplus._M_p._0_4_ = 3;
      makeName((string *)buf,this,name);
      pCVar2 = (ConstantString *)
               insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                         (this,(LiteralType *)&local_88,&rhs_local,(string *)buf);
      this_00 = (string *)buf;
    }
    else {
      snprintf(buf,0x40,"%li",*(undefined8 *)(lVar1 + 0x48));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,buf,&local_91);
      pCVar2 = get(this,&local_88);
      this_00 = &local_88;
    }
    std::__cxx11::string::~string((string *)this_00);
    return (Value *)pCVar2;
  }
  __assert_fail("rhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x246,"Value *flow::IRBuilder::createN2S(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createN2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto i = dynamic_cast<ConstantInt*>(rhs)) {
    char buf[64];
    snprintf(buf, sizeof(buf), "%" PRIi64 "", i->get());
    return get(buf);
  }

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}